

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 roundAndPackFloatx80_sparc
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  floatx80 fVar11;
  uint64_t local_40;
  uint64_t zSig1_local;
  
  bVar3 = status->float_rounding_mode;
  iVar7 = (int)CONCAT71(in_register_00000039,roundingPrecision);
  zSig1_local = zSig1;
  if (iVar7 == 0x40) {
    uVar9 = 0x7ff;
    uVar8 = 0x400;
LAB_008abb6e:
    local_40 = zSig1 != 0 | zSig0;
    switch(bVar3) {
    case 0:
    case 4:
      break;
    case 1:
      uVar8 = 0;
      if (zSign != '\0') {
        uVar8 = uVar9;
      }
      break;
    case 2:
      uVar8 = 0;
      if (zSign == '\0') {
        uVar8 = uVar9;
      }
      break;
    case 3:
      uVar8 = 0;
      break;
    default:
switchD_008abb98_default:
      abort();
    }
    if (zExp - 0x7ffeU < 0xffff8003) {
      if ((zExp < 0x7fff) && ((uVar2 = ~local_40, zExp != 0x7ffe || (uVar8 <= uVar2)))) {
        if (0 < zExp) goto LAB_008abc0c;
        if (status->flush_to_zero != '\0') {
          status->float_exception_flags = status->float_exception_flags | 0x80;
          uVar6 = (uint)zSign << 0xf;
          zSig0 = 0;
          goto LAB_008abcde;
        }
        cVar1 = status->float_detect_tininess;
        shift64RightJamming(local_40,1 - zExp,&local_40);
        uVar4 = local_40 & uVar9;
        if (uVar4 == 0 || uVar2 < uVar8 && (zExp == 0 && cVar1 != '\x01')) {
          if (uVar4 != 0) {
            bVar5 = status->float_exception_flags;
            goto LAB_008abe56;
          }
        }
        else {
          bVar5 = status->float_exception_flags | 0x10;
LAB_008abe56:
          status->float_exception_flags = bVar5 | 0x20;
        }
        uVar2 = uVar9 + 1;
        if (uVar4 * 2 != uVar9 + 1) {
          uVar2 = 0;
        }
        if (bVar3 != 0) {
          uVar2 = 0;
        }
        zSig0 = ~(uVar2 | uVar9) & local_40 + uVar8;
        uVar6 = (uint)zSign << 0xf | (uint)(local_40 + uVar8 >> 0x3f);
        goto LAB_008abcde;
      }
      goto LAB_008abcac;
    }
LAB_008abc0c:
    if ((uVar9 & local_40) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    uVar2 = uVar8 + local_40;
    if (CARRY8(uVar8,local_40)) {
      uVar2 = 0x8000000000000000;
    }
    uVar4 = uVar9 + 1;
    if ((uVar9 & local_40) * 2 != uVar9 + 1) {
      uVar4 = 0;
    }
    if (bVar3 != 0) {
      uVar4 = 0;
    }
    zSig0 = ~(uVar4 | uVar9) & uVar2;
    zExp = zExp + (uint)CARRY8(uVar8,local_40);
    if (zSig0 == 0) {
      zExp = 0;
    }
    goto LAB_008abc52;
  }
  if (iVar7 == 0x20) {
    uVar9 = 0xffffffffff;
    uVar8 = 0x8000000000;
    goto LAB_008abb6e;
  }
  uVar6 = (uint)bVar3;
  local_40 = zSig0;
  if (4 < uVar6) goto switchD_008abb98_default;
  switch((ulong)uVar6) {
  default:
    bVar5 = (byte)(zSig1 >> 0x3f);
    break;
  case 1:
    bVar10 = zSign != '\0';
    goto LAB_008abc70;
  case 2:
    bVar10 = zSign == '\0';
LAB_008abc70:
    bVar5 = zSig1 != 0 & bVar10;
    break;
  case 3:
    bVar5 = 0;
  }
  if (zExp - 0x7ffeU < 0xffff8003) {
    if ((0x7ffe < zExp) || (((zSig0 == 0xffffffffffffffff && zExp == 0x7ffe) & bVar5) == 1)) {
      uVar9 = 0;
LAB_008abcac:
      status->float_exception_flags = status->float_exception_flags | 0x28;
      if (((bVar3 == 3) || (zSign != '\0' && bVar3 == 2)) || (bVar3 == 1 && zSign == '\0')) {
        zSig0 = ~uVar9;
        uVar6 = (uint)zSign << 0xf | 0x7ffe;
      }
      else {
        uVar6 = (uint)zSign << 0xf | 0x7fff;
        zSig0 = 0x8000000000000000;
      }
      goto LAB_008abcde;
    }
    if (zExp < 1) {
      cVar1 = status->float_detect_tininess;
      shift64ExtraRightJamming(zSig0,zSig1,1 - zExp,&local_40,&zSig1_local);
      if ((zSig1_local != 0 & (~(bVar5 & zExp == 0 & cVar1 != '\x01') | zSig0 != 0xffffffffffffffff)
          ) == 1) {
        bVar3 = status->float_exception_flags | 0x10;
      }
      else {
        if (zSig1_local == 0) goto LAB_008abe34;
        bVar3 = status->float_exception_flags;
      }
      status->float_exception_flags = bVar3 | 0x20;
LAB_008abe34:
      fVar11 = (floatx80)(*(code *)(&DAT_00baedc4 + *(int *)(&DAT_00baedc4 + (ulong)uVar6 * 4)))();
      return fVar11;
    }
  }
  if (zSig1 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (bVar5 == 0) {
    if (zSig0 == 0) {
      zExp = 0;
    }
  }
  else if (zSig0 + 1 == 0) {
    zExp = zExp + 1;
    zSig0 = 0x8000000000000000;
  }
  else {
    zSig0 = zSig0 + 1 & ~(ulong)((zSig1 & 0x7fffffffffffffff) == 0 && uVar6 == 0);
  }
LAB_008abc52:
  uVar6 = (uint)zSign * 0x8000 + zExp;
LAB_008abcde:
  fVar11._8_4_ = uVar6;
  fVar11.low = zSig0;
  fVar11._12_4_ = 0;
  return fVar11;
}

Assistant:

floatx80 roundAndPackFloatx80(int8_t roundingPrecision, flag zSign,
                              int32_t zExp, uint64_t zSig0, uint64_t zSig1,
                              float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;
    int64_t roundIncrement, roundMask, roundBits;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    if ( roundingPrecision == 80 ) goto precision80;
    if ( roundingPrecision == 64 ) {
        roundIncrement = UINT64_C(0x0000000000000400);
        roundMask = UINT64_C(0x00000000000007FF);
    }
    else if ( roundingPrecision == 32 ) {
        roundIncrement = UINT64_C(0x0000008000000000);
        roundMask = UINT64_C(0x000000FFFFFFFFFF);
    }
    else {
        goto precision80;
    }
    zSig0 |= ( zSig1 != 0 );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : roundMask;
        break;
    case float_round_down:
        roundIncrement = zSign ? roundMask : 0;
        break;
    default:
        abort();
    }
    roundBits = zSig0 & roundMask;
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || ( ( zExp == 0x7FFE ) && ( zSig0 + roundIncrement < zSig0 ) )
           ) {
            goto overflow;
        }
        if ( zExp <= 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloatx80(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ( zSig0 <= zSig0 + roundIncrement );
            shift64RightJamming( zSig0, 1 - zExp, &zSig0 );
            zExp = 0;
            roundBits = zSig0 & roundMask;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundBits) {
                status->float_exception_flags |= float_flag_inexact;
            }
            zSig0 += roundIncrement;
            if ( (int64_t) zSig0 < 0 ) zExp = 1;
            roundIncrement = roundMask + 1;
            if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
                roundMask |= roundIncrement;
            }
            zSig0 &= ~ roundMask;
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig0 += roundIncrement;
    if ( zSig0 < roundIncrement ) {
        ++zExp;
        zSig0 = UINT64_C(0x8000000000000000);
    }
    roundIncrement = roundMask + 1;
    if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
        roundMask |= roundIncrement;
    }
    zSig0 &= ~ roundMask;
    if ( zSig0 == 0 ) zExp = 0;
    return packFloatx80( zSign, zExp, zSig0 );
 precision80:
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig1;
        break;
    case float_round_down:
        increment = zSign && zSig1;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || (    ( zExp == 0x7FFE )
                  && ( zSig0 == UINT64_C(0xFFFFFFFFFFFFFFFF) )
                  && increment
                )
           ) {
            roundMask = 0;
 overflow:
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
               ) {
                return packFloatx80( zSign, 0x7FFE, ~ roundMask );
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( zExp <= 0 ) {
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ! increment
                || ( zSig0 < UINT64_C(0xFFFFFFFFFFFFFFFF) );
            shift64ExtraRightJamming( zSig0, zSig1, 1 - zExp, &zSig0, &zSig1 );
            zExp = 0;
            if (isTiny && zSig1) {
                float_raise(float_flag_underflow, status);
            }
            if (zSig1) {
                status->float_exception_flags |= float_flag_inexact;
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig1 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig1;
                break;
            case float_round_down:
                increment = zSign && zSig1;
                break;
            default:
                abort();
            }
            if ( increment ) {
                ++zSig0;
                zSig0 &=
                    ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
                if ( (int64_t) zSig0 < 0 ) zExp = 1;
            }
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (zSig1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        ++zSig0;
        if ( zSig0 == 0 ) {
            ++zExp;
            zSig0 = UINT64_C(0x8000000000000000);
        }
        else {
            zSig0 &= ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
        }
    }
    else {
        if ( zSig0 == 0 ) zExp = 0;
    }
    return packFloatx80( zSign, zExp, zSig0 );

}